

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::InflateScriptContext
               (SnapContext *snpCtx,ScriptContext *intoCtx,InflateMap *inflator,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
               *topLevelLoadScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
               *topLevelNewScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
               *topLevelEvalScriptMap)

{
  JavascriptLibrary *pJVar1;
  TopLevelFunctionInContextRelation *pTVar2;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo;
  TopLevelNewFunctionBodyResolveInfo *fbInfo_00;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_01;
  Type TVar3;
  bool bVar4;
  int iVar5;
  FunctionBody *pFVar6;
  Entry *pEVar7;
  Entry *pEVar8;
  Entry *pEVar9;
  ulong uVar10;
  long lVar11;
  uint32 i;
  void *unaff_retaddr;
  undefined1 auStack_c8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  ScriptContext *__localScriptContext;
  
  iVar5 = PAL_wcscmp((snpCtx->ContextSRC).Contents,intoCtx->url);
  if (iVar5 == 0) {
    Js::JavascriptLibrary::SetIsPRNGSeeded
              ((intoCtx->super_ScriptContextBase).javascriptLibrary,snpCtx->IsPNRGSeeded);
    pJVar1 = (intoCtx->super_ScriptContextBase).javascriptLibrary;
    TVar3 = snpCtx->RandomSeed1;
    pJVar1->randSeed0 = snpCtx->RandomSeed0;
    pJVar1->randSeed1 = TVar3;
    InflateMap::AddScriptContext(inflator,snpCtx->ScriptContextLogId,intoCtx);
    ScriptContextTTD::ClearLoadedSourcesForSnapshotRestore(intoCtx->TTDContextInfo);
    bVar4 = Js::ScriptContext::HasRecordedException(intoCtx);
    if (bVar4) {
      Js::ScriptContext::GetAndClearRecordedException(intoCtx,(bool *)0x0);
    }
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < snpCtx->LoadedTopLevelScriptCount; uVar10 = uVar10 + 1) {
      pTVar2 = snpCtx->LoadedTopLevelScriptArray;
      pFVar6 = InflateMap::FindReusableFunctionBodyIfExists
                         (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11)
                         );
      pEVar7 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
               ::FindSlotForId<false>
                         (topLevelLoadScriptMap,
                          (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
      fbInfo = pEVar7->Data;
      if (pFVar6 == (FunctionBody *)0x0) {
        pFVar6 = InflateTopLevelLoadedFunctionBodyInfo(fbInfo,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,pFVar6,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterLoadedScript
                  (intoCtx->TTDContextInfo,pFVar6,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (intoCtx->threadContext->TTDExecutionInfo,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11),pFVar6);
      }
      InflateMap::UpdateFBScopes(inflator,&(fbInfo->TopLevelBase).ScopeChainInfo,pFVar6);
      InflateMap::AddInflationFunctionBody
                (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11),pFVar6);
      lVar11 = lVar11 + 0x10;
    }
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,intoCtx,
               (ScriptEntryExitRecord *)auStack_c8,unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(intoCtx,true,true);
    Js::EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      if (snpCtx->NewFunctionTopLevelScriptCount <= uVar10) break;
      pTVar2 = snpCtx->NewFunctionTopLevelScriptArray;
      pFVar6 = InflateMap::FindReusableFunctionBodyIfExists
                         (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11)
                         );
      pEVar8 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
               ::FindSlotForId<false>
                         (topLevelNewScriptMap,
                          (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
      fbInfo_00 = pEVar8->Data;
      if (pFVar6 == (FunctionBody *)0x0) {
        pFVar6 = InflateTopLevelNewFunctionBodyInfo(fbInfo_00,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,pFVar6,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterNewScript
                  (intoCtx->TTDContextInfo,pFVar6,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (intoCtx->threadContext->TTDExecutionInfo,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11),pFVar6);
      }
      InflateMap::UpdateFBScopes(inflator,&(fbInfo_00->TopLevelBase).ScopeChainInfo,pFVar6);
      InflateMap::AddInflationFunctionBody
                (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11),pFVar6);
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x10;
    }
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < snpCtx->EvalTopLevelScriptCount; uVar10 = uVar10 + 1) {
      pTVar2 = snpCtx->EvalTopLevelScriptArray;
      pFVar6 = InflateMap::FindReusableFunctionBodyIfExists
                         (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11)
                         );
      pEVar9 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
               ::FindSlotForId<false>
                         (topLevelEvalScriptMap,
                          (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
      fbInfo_01 = pEVar9->Data;
      if (pFVar6 == (FunctionBody *)0x0) {
        pFVar6 = InflateTopLevelEvalFunctionBodyInfo(fbInfo_01,intoCtx);
      }
      else {
        ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (intoCtx->TTDContextInfo,pFVar6,(FunctionBody *)0x0);
        ScriptContextTTD::RegisterEvalScript
                  (intoCtx->TTDContextInfo,pFVar6,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11));
        ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                  (intoCtx->threadContext->TTDExecutionInfo,
                   *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar11),pFVar6);
      }
      InflateMap::UpdateFBScopes(inflator,&(fbInfo_01->TopLevelBase).ScopeChainInfo,pFVar6);
      InflateMap::AddInflationFunctionBody
                (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar11),pFVar6);
      lVar11 = lVar11 + 0x10;
    }
    Js::EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    return;
  }
  TTDAbort_unrecoverable_error("Make sure the src uri values are the same.");
}

Assistant:

void InflateScriptContext(const SnapContext* snpCtx, Js::ScriptContext* intoCtx, InflateMap* inflator,
            const TTDIdentifierDictionary<uint64, TopLevelScriptLoadFunctionBodyResolveInfo*>& topLevelLoadScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelNewFunctionBodyResolveInfo*>& topLevelNewScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelEvalFunctionBodyResolveInfo*>& topLevelEvalScriptMap)
        {
            TTDAssert(wcscmp(snpCtx->ContextSRC.Contents, intoCtx->GetUrl()) == 0, "Make sure the src uri values are the same.");

            intoCtx->GetLibrary()->SetIsPRNGSeeded(snpCtx->IsPNRGSeeded);
            intoCtx->GetLibrary()->SetRandSeed0(snpCtx->RandomSeed0);
            intoCtx->GetLibrary()->SetRandSeed1(snpCtx->RandomSeed1);
            inflator->AddScriptContext(snpCtx->ScriptContextLogId, intoCtx);

            intoCtx->TTDContextInfo->ClearLoadedSourcesForSnapshotRestore();

            if(intoCtx->HasRecordedException())
            {
                intoCtx->GetAndClearRecordedException(nullptr);
            }

            for(uint32 i = 0; i < snpCtx->LoadedTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation& cri = snpCtx->LoadedTopLevelScriptArray[i];

                Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                const TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo = topLevelLoadScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                if(fb == nullptr)
                {
                    fb = NSSnapValues::InflateTopLevelLoadedFunctionBodyInfo(fbInfo, intoCtx);
                }
                else
                {
                    intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                    intoCtx->TTDContextInfo->RegisterLoadedScript(fb, cri.TopLevelBodyCtr);

                    intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                }

                inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
            }

            //The inflation code for NewFunction and Eval uses the paths in the runtime (which assume they are in script) -- so enter here to make them happy
            BEGIN_ENTER_SCRIPT(intoCtx, true, true, true)
            {
                for(uint32 i = 0; i < snpCtx->NewFunctionTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->NewFunctionTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelNewFunctionBodyResolveInfo* fbInfo = topLevelNewScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelNewFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterNewScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }

                for(uint32 i = 0; i < snpCtx->EvalTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->EvalTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelEvalFunctionBodyResolveInfo* fbInfo = topLevelEvalScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelEvalFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterEvalScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }
            }
            END_ENTER_SCRIPT
        }